

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture1.c
# Opt level: O0

ktx_size_t ktxTexture1_calcDataSizeLevels(ktxTexture1 *This,ktx_uint32_t levels)

{
  uint in_ESI;
  long in_RDI;
  ktx_size_t levelSize;
  ktx_size_t dataSize;
  ktx_uint32_t i;
  ktxFormatVersionEnum in_stack_ffffffffffffffd8;
  ktx_uint32_t in_stack_ffffffffffffffdc;
  ktxTexture *in_stack_ffffffffffffffe0;
  ktx_size_t local_18;
  uint local_10;
  
  local_18 = 0;
  if (in_RDI == 0) {
    __assert_fail("This != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture1.c"
                  ,0x36e,"ktx_size_t ktxTexture1_calcDataSizeLevels(ktxTexture1 *, ktx_uint32_t)");
  }
  if (in_ESI <= *(uint *)(in_RDI + 0x34)) {
    for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
      in_stack_ffffffffffffffe0 =
           (ktxTexture *)
           ktxTexture_calcLevelSize
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)
      ;
      local_18 = (long)&in_stack_ffffffffffffffe0->classId + local_18;
    }
    return local_18;
  }
  __assert_fail("levels <= This->numLevels",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/texture1.c"
                ,0x36f,"ktx_size_t ktxTexture1_calcDataSizeLevels(ktxTexture1 *, ktx_uint32_t)");
}

Assistant:

ktx_size_t
ktxTexture1_calcDataSizeLevels(ktxTexture1* This, ktx_uint32_t levels)
{
    ktx_uint32_t i;
    ktx_size_t dataSize = 0;

    assert(This != NULL);
    assert(levels <= This->numLevels);
    for (i = 0; i < levels; i++) {
        ktx_size_t levelSize = ktxTexture_calcLevelSize(ktxTexture(This), i,
                                                        KTX_FORMAT_VERSION_ONE);
        /* mipPadding. NOTE: this adds padding after the last level too. */
        #if KTX_GL_UNPACK_ALIGNMENT != 4
            dataSize += _KTX_PAD4(levelSize);
        #else
            dataSize += levelSize;
        #endif
    }
    return dataSize;
}